

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

ChArchiveOut * __thiscall
chrono::ChArchiveOut::operator<<
          (ChArchiveOut *this,ChNameValue<std::shared_ptr<myEmployeeBoss>_> *bVal)

{
  ChNameValue<std::shared_ptr<myEmployeeBoss>_> local_30;
  ChNameValue<std::shared_ptr<myEmployeeBoss>_> *local_18;
  ChNameValue<std::shared_ptr<myEmployeeBoss>_> *bVal_local;
  ChArchiveOut *this_local;
  
  local_18 = bVal;
  bVal_local = (ChNameValue<std::shared_ptr<myEmployeeBoss>_> *)this;
  ChNameValue<std::shared_ptr<myEmployeeBoss>_>::ChNameValue(&local_30,bVal);
  out<myEmployeeBoss>(this,&local_30);
  ChNameValue<std::shared_ptr<myEmployeeBoss>_>::~ChNameValue(&local_30);
  return this;
}

Assistant:

ChArchiveOut& operator<<(ChNameValue<T> bVal) {
          this->out(bVal);
          return (*this);
      }